

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestreamout_file.hpp
# Opt level: O3

BOOL __thiscall ByteStreamOutFile::seekEnd(ByteStreamOutFile *this)

{
  int iVar1;
  
  iVar1 = fseeko((FILE *)this->file,0,2);
  return iVar1 == 0;
}

Assistant:

inline BOOL ByteStreamOutFile::seekEnd()
{
#if defined _WIN32 && ! defined (__MINGW32__)
  return !(_fseeki64(file, 0, SEEK_END));
#elif defined (__MINGW32__)
  return !(fseeko64(file, (off_t)0, SEEK_END));
#else
  return !(fseeko(file, (off_t)0, SEEK_END));
#endif
}